

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

optional_ptr<duckdb::RowVersionManager,_true> __thiscall
duckdb::RowGroup::GetVersionInfo(RowGroup *this)

{
  idx_t iVar1;
  MetadataManager *manager;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  reference pvVar5;
  MetadataManager *start;
  RowVersionManager *pRVar6;
  MetaBlockPointer delete_pointer;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  if (((this->deletes_pointers).
       super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_start ==
       (this->deletes_pointers).
       super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_finish) ||
     (((this->deletes_is_loaded)._M_base._M_i & 1U) != 0)) {
    pRVar6 = (this->version_info)._M_i.ptr;
  }
  else {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->row_group_lock);
    if (iVar4 != 0) {
      ::std::__throw_system_error(iVar4);
    }
    if (((this->deletes_pointers).
         super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         (this->deletes_pointers).
         super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
         _M_impl.super__Vector_impl_data._M_finish) ||
       (((this->deletes_is_loaded)._M_base._M_i & 1U) != 0)) {
      pRVar6 = (this->version_info)._M_i.ptr;
    }
    else {
      pvVar5 = vector<duckdb::MetaBlockPointer,_true>::operator[](&this->deletes_pointers,0);
      iVar1 = pvVar5->block_pointer;
      manager = *(MetadataManager **)&pvVar5->offset;
      start = BlockManager::GetMetadataManager(((this->collection)._M_data)->block_manager);
      delete_pointer._8_8_ = iVar1;
      delete_pointer.block_pointer = (idx_t)&local_38;
      RowVersionManager::Deserialize(delete_pointer,manager,(idx_t)start);
      p_Var3 = p_Stack_30;
      peVar2 = local_38;
      local_38 = (element_type *)0x0;
      p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->owned_version_info).internal.
                super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->owned_version_info).internal.
      super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      (this->owned_version_info).internal.
      super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      LOCK();
      (this->version_info)._M_i.ptr =
           (this->owned_version_info).internal.
           super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      UNLOCK();
      LOCK();
      (this->deletes_is_loaded)._M_base._M_i = true;
      UNLOCK();
      pRVar6 = (this->version_info)._M_i.ptr;
      if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->row_group_lock);
  }
  return (optional_ptr<duckdb::RowVersionManager,_true>)pRVar6;
}

Assistant:

optional_ptr<RowVersionManager> RowGroup::GetVersionInfo() {
	if (!HasUnloadedDeletes()) {
		// deletes are loaded - return the version info
		return version_info;
	}
	lock_guard<mutex> lock(row_group_lock);
	// double-check after obtaining the lock whether or not deletes are still not loaded to avoid double load
	if (!HasUnloadedDeletes()) {
		return version_info;
	}
	// deletes are not loaded - reload
	auto root_delete = deletes_pointers[0];
	auto loaded_info = RowVersionManager::Deserialize(root_delete, GetBlockManager().GetMetadataManager(), start);
	SetVersionInfo(std::move(loaded_info));
	deletes_is_loaded = true;
	return version_info;
}